

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::ebml_read_skip(MatroskaDemuxer *this)

{
  int local_2c;
  uint64_t uStack_28;
  int res;
  int64_t length;
  MatroskaDemuxer *pMStack_18;
  uint32_t id;
  MatroskaDemuxer *this_local;
  
  pMStack_18 = this;
  local_2c = ebml_read_element_id(this,(uint32_t *)((long)&length + 4),(int *)0x0);
  if ((-1 < local_2c) &&
     (local_2c = ebml_read_element_length(this,(int64_t *)&stack0xffffffffffffffd8), -1 < local_2c))
  {
    IOContextDemuxer::skip_bytes(&this->super_IOContextDemuxer,uStack_28);
    return 0;
  }
  return local_2c;
}

Assistant:

int MatroskaDemuxer::ebml_read_skip()
{
    uint32_t id;
    int64_t length;
    int res;

    if ((res = ebml_read_element_id(&id, nullptr)) < 0 || (res = ebml_read_element_length(&length)) < 0)
        return res;
    skip_bytes(length);
    return 0;
}